

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

void __thiscall
ParsedH264TrackData::extractData(ParsedH264TrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  size_t sVar6;
  uint8_t *puVar7;
  ostream *poVar8;
  undefined4 *puVar9;
  ulong uVar10;
  uint32_t *cur32;
  uint32_t *puVar11;
  uint32_t *puVar12;
  uint32_t *cur32_1;
  ulong uVar13;
  int local_1fc;
  uint8_t *dst;
  AVPacket *local_1f0;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  bVar1 = this->m_firstExtract;
  local_1f0 = pkt;
  local_1fc = size;
  if ((bool)bVar1 == true) {
    iVar2 = (*(this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData[5])
                      (this,buff,(ulong)(uint)size);
    if ((char)iVar2 != '\0') {
      this->m_firstExtract = false;
      goto LAB_001b0833;
    }
    bVar1 = this->m_firstExtract;
  }
  if ((bVar1 & 1) != 0) {
    sVar6 = getSPSPPSLen(this);
    local_1fc = (int)sVar6 + size;
  }
LAB_001b0833:
  puVar12 = (uint32_t *)(buff + size);
  uVar10 = (ulong)this->m_nalSize;
  iVar2 = 0;
  puVar11 = (uint32_t *)buff;
  uVar13 = uVar10;
  do {
    iVar3 = (int)uVar10;
    if ((uint32_t *)((long)puVar12 - uVar10) < puVar11) {
      if (puVar11 != puVar12) {
        __assert_fail("curPos == end",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                      ,0x8d,
                      "virtual void ParsedH264TrackData::extractData(AVPacket *, uint8_t *, const int)"
                     );
      }
      local_1fc = (4 - iVar3) * iVar2 + local_1fc;
      puVar7 = (uint8_t *)operator_new__((long)local_1fc);
      local_1f0->data = puVar7;
      local_1f0->size = local_1fc;
      dst = puVar7;
      if (this->m_firstExtract == true) {
        iVar2 = writeSPSPPS(this,puVar7);
        dst = puVar7 + iVar2;
        uVar13 = (ulong)this->m_nalSize;
      }
      while( true ) {
        uVar5 = (uint)(byte)uVar13;
        if ((uint32_t *)((long)puVar12 - (ulong)uVar5) < buff) {
          this->m_firstExtract = false;
          return;
        }
        if ((byte)uVar13 == 2) {
          uVar4 = (uint32_t)
                  (ushort)((ushort)*(uint32_t *)buff << 8 | (ushort)*(uint32_t *)buff >> 8);
        }
        else if (uVar5 == 3) {
          uVar4 = (uint)*(byte *)((long)buff + 2) |
                  (uint)*(byte *)((long)buff + 1) << 8 | (uint)(byte)*(uint32_t *)buff << 0x10;
        }
        else {
          if (uVar5 != 4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
            poVar8 = std::operator<<((ostream *)&ss,"Unsupported nal unit size ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            puVar9 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar9 = 3;
            *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
            if (local_1e8 == &local_1d8) {
              puVar9[6] = local_1d8;
              puVar9[7] = uStack_1d4;
              puVar9[8] = uStack_1d0;
              puVar9[9] = uStack_1cc;
            }
            else {
              *(uint **)(puVar9 + 2) = local_1e8;
              *(ulong *)(puVar9 + 6) = CONCAT44(uStack_1d4,local_1d8);
            }
            *(undefined8 *)(puVar9 + 4) = local_1e0;
            local_1e0 = 0;
            local_1d8 = local_1d8 & 0xffffff00;
            local_1e8 = &local_1d8;
            __cxa_throw(puVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          uVar4 = my_ntohl(*(uint32_t *)buff);
        }
        writeNalHeader(&dst);
        puVar7 = dst;
        if ((char)*(byte *)((long)buff + (ulong)this->m_nalSize) < '\0') break;
        uVar5 = (int)puVar12 - (int)buff;
        if (uVar4 < uVar5) {
          uVar5 = uVar4;
        }
        memcpy(dst,(byte *)((ulong)this->m_nalSize + (long)buff),(ulong)uVar5);
        uVar13 = (ulong)this->m_nalSize;
        buff = (uint8_t *)((long)buff + (ulong)(this->m_nalSize + uVar4));
        dst = puVar7 + uVar4;
      }
      __assert_fail("(curPos[m_nalSize] & 0x80) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                    ,0xab,
                    "virtual void ParsedH264TrackData::extractData(AVPacket *, uint8_t *, const int)"
                   );
    }
    if ((char)uVar10 == '\x02') {
      uVar4 = (uint32_t)(ushort)((ushort)*puVar11 << 8 | (ushort)*puVar11 >> 8);
      uVar10 = 2;
    }
    else if (iVar3 == 3) {
      uVar4 = (uint)*(byte *)((long)puVar11 + 2) |
              (uint)*(byte *)((long)puVar11 + 1) << 8 | (uint)(byte)*puVar11 << 0x10;
      uVar10 = 3;
    }
    else {
      if (iVar3 != 4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar8 = std::operator<<((ostream *)&ss,"Unsupported nal unit size ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        puVar9 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar9 = 3;
        *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
        if (local_1c8 == &local_1b8) {
          puVar9[6] = local_1b8;
          puVar9[7] = uStack_1b4;
          puVar9[8] = uStack_1b0;
          puVar9[9] = uStack_1ac;
        }
        else {
          *(uint **)(puVar9 + 2) = local_1c8;
          *(ulong *)(puVar9 + 6) = CONCAT44(uStack_1b4,local_1b8);
        }
        *(undefined8 *)(puVar9 + 4) = local_1c0;
        local_1c0 = 0;
        local_1b8 = local_1b8 & 0xffffff00;
        local_1c8 = &local_1b8;
        __cxa_throw(puVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      uVar4 = my_ntohl(*puVar11);
      uVar10 = (ulong)this->m_nalSize;
      uVar13 = uVar10;
    }
    iVar2 = iVar2 + 1;
    puVar11 = (uint32_t *)((long)puVar11 + (ulong)((int)uVar10 + uVar4));
  } while( true );
}

Assistant:

void ParsedH264TrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    int newBufSize = size;
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    int elements = 0;

    if (m_firstExtract && spsppsExists(buff, size))
        m_firstExtract = false;

    if (m_firstExtract)
        newBufSize += static_cast<int>(getSPSPPSLen());

    while (curPos <= end - m_nalSize)
    {
        uint32_t elSize = 0;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else if (m_nalSize == 3)
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        else if (m_nalSize == 2)
            elSize = (curPos[0] << 8l) + curPos[1];
        else
            THROW(ERR_COMMON, "Unsupported nal unit size " << elSize)
        elements++;
        curPos += elSize + m_nalSize;
    }
    assert(curPos == end);
    if (curPos > end)
    {
        LTRACE(LT_ERROR, 2, "Matroska parse error: invalid H264 NAL unit size. NAL unit truncated.");
    }
    newBufSize += elements * (4 - m_nalSize);
    pkt->data = new uint8_t[newBufSize];
    pkt->size = newBufSize;

    uint8_t* dst = pkt->data;
    if (m_firstExtract)
    {
        dst += writeSPSPPS(dst);
    }
    curPos = buff;
    while (curPos <= end - m_nalSize)
    {
        uint32_t elSize = 0;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else if (m_nalSize == 3)
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        else if (m_nalSize == 2)
            elSize = (curPos[0] << 8l) + curPos[1];
        else
            THROW(ERR_COMMON, "Unsupported nal unit size " << elSize)
        writeNalHeader(dst);
        assert((curPos[m_nalSize] & 0x80) == 0);
        memcpy(dst, curPos + m_nalSize, FFMIN(elSize, (uint32_t)(end - curPos)));
        curPos += elSize + m_nalSize;
        dst += elSize;
    }
    m_firstExtract = false;
}